

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::EndElement(cmXMLWriter *this)

{
  ostream *poVar1;
  reference pvVar2;
  cmXMLWriter *this_local;
  
  if (this->Indent != 0) {
    this->Indent = this->Indent - 1;
    if ((this->ElementOpen & 1U) == 0) {
      ConditionalLineBreak(this,(bool)((this->IsContent ^ 0xffU) & 1));
      this->IsContent = false;
      poVar1 = std::operator<<(this->Output,"</");
      pvVar2 = std::
               stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::top(&this->Elements);
      poVar1 = std::operator<<(poVar1,(string *)pvVar2);
      std::operator<<(poVar1,'>');
    }
    else {
      std::operator<<(this->Output,"/>");
    }
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop(&this->Elements);
    this->ElementOpen = false;
    return;
  }
  __assert_fail("this->Indent > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmXMLWriter.cxx"
                ,0x30,"void cmXMLWriter::EndElement()");
}

Assistant:

void cmXMLWriter::EndElement()
{
  assert(this->Indent > 0);
  --this->Indent;
  if (this->ElementOpen) {
    this->Output << "/>";
  } else {
    this->ConditionalLineBreak(!this->IsContent);
    this->IsContent = false;
    this->Output << "</" << this->Elements.top() << '>';
  }
  this->Elements.pop();
  this->ElementOpen = false;
}